

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::predict
          (FastText *this,int32_t k,vector<int,_std::allocator<int>_> *words,
          Predictions *predictions,real threshold)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  invalid_argument *this_01;
  State *in_RDI;
  State state;
  State *in_stack_ffffffffffffff50;
  Predictions *in_stack_ffffffffffffff68;
  real in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff74;
  int32_t in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff7c;
  State *in_stack_ffffffffffffff80;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)in_RDI)
  ;
  if (!bVar1) {
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ad4de);
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1ad4f6);
    Dictionary::nlabels(this_00);
    Model::State::State(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ad51a);
    if (peVar2->model != sup) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Model needs to be supervised for prediction!");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ad59b);
    Model::predict((Model *)in_stack_ffffffffffffff80,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   in_RDI);
    Model::State::~State(in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void FastText::predict(
    int32_t k,
    const std::vector<int32_t>& words,
    Predictions& predictions,
    real threshold) const {
  if (words.empty()) {
    return;
  }
  Model::State state(args_->dim, dict_->nlabels(), 0);
  if (args_->model != model_name::sup) {
    throw std::invalid_argument("Model needs to be supervised for prediction!");
  }
  model_->predict(words, k, threshold, predictions, state);
}